

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strrchr.c
# Opt level: O0

char * strrchr(char *__s,int __c)

{
  char *pcVar1;
  long lVar2;
  long local_28;
  size_t i;
  int c_local;
  char *s_local;
  
  local_28 = 0;
  do {
    lVar2 = local_28 + 1;
    pcVar1 = __s + local_28;
    local_28 = lVar2;
  } while (*pcVar1 != '\0');
  do {
    lVar2 = local_28 + -1;
    if (__s[local_28 + -1] == (char)__c) {
      return __s + lVar2;
    }
    local_28 = lVar2;
  } while (lVar2 != 0);
  return (char *)0x0;
}

Assistant:

char * strrchr( const char * s, int c )
{
    size_t i = 0;

    while ( s[i++] )
    {
        /* EMPTY */
    }

    do
    {
        if ( s[--i] == ( char ) c )
        {
            return ( char * ) s + i;
        }
    } while ( i );

    return NULL;
}